

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

void __thiscall Clasp::Solver::updateVars(Solver *this)

{
  size_type sVar1;
  size_type ns;
  left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U> local_38;
  
  sVar1 = (this->assign_).assign_.ebo_.size;
  ns = (this->shared_->varInfo_).ebo_.size;
  if (ns - 1 < sVar1 - 1) {
    popVars(this,sVar1 - ns,false,(ConstraintDB *)0x0);
    return;
  }
  local_38.super_type.super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_ =
       (buf_type *)
       ((ulong)local_38.super_type.super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.
               buf_ & 0xffffffff00000000);
  bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&(this->assign_).assign_,ns,(uint *)&local_38);
  local_38.super_type.super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_ =
       (buf_type *)0x0;
  bk_lib::pod_vector<Clasp::Antecedent,_std::allocator<Clasp::Antecedent>_>::resize
            (&(this->assign_).reason_.super_type,ns,(Antecedent *)&local_38);
  local_38.super_type.super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.right_ = 0;
  local_38.super_type.super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_ =
       (buf_type *)0x0;
  local_38.super_type.super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>._8_4_ = 0;
  local_38.super_type.super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.left_ = 0;
  bk_lib::
  pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
  ::resize(&this->watches_,(this->assign_).assign_.ebo_.size * 2,&local_38);
  if ((int)local_38.super_type.super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>._8_4_ <
      0) {
    operator_delete(local_38.super_type.
                    super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_);
  }
  return;
}

Assistant:

void Solver::updateVars() {
	if (numVars() > shared_->numVars()) {
		popVars(numVars() - shared_->numVars(), false, 0);
	}
	else {
		assign_.resize(shared_->numVars() + 1);
		watches_.resize(assign_.numVars()<<1);
	}
}